

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  agc_t *agc;
  model_def_t *pmVar1;
  feat_t *pfVar2;
  cmn_type_t cmn;
  agc_type_t agc_00;
  int32 iVar3;
  int iVar4;
  cmd_ln_t *pcVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  int32 **subvecs;
  uint32 *puVar10;
  cmn_t *pcVar11;
  double dVar12;
  uint32 n_cb;
  uint32 n_ts;
  char *local_38;
  
  parse_cmd_ln(argc,argv);
  pcVar5 = cmd_ln_get();
  pcVar6 = cmd_ln_str_r(pcVar5,"-feat");
  pcVar5 = cmd_ln_get();
  pcVar7 = cmd_ln_str_r(pcVar5,"-cmn");
  cmn = cmn_type_from_str(pcVar7);
  pcVar5 = cmd_ln_get();
  lVar8 = cmd_ln_int_r(pcVar5,"-varnorm");
  pcVar5 = cmd_ln_get();
  pcVar7 = cmd_ln_str_r(pcVar5,"-agc");
  agc_00 = agc_type_from_str(pcVar7);
  pcVar5 = cmd_ln_get();
  lVar9 = cmd_ln_int_r(pcVar5,"-ceplen");
  feat = feat_init(pcVar6,cmn,(uint)(lVar8 != 0),agc_00,1,(int32)lVar9);
  pcVar5 = cmd_ln_get();
  pcVar6 = cmd_ln_str_r(pcVar5,"-lda");
  if (pcVar6 != (char *)0x0) {
    pcVar5 = cmd_ln_get();
    pcVar6 = cmd_ln_str_r(pcVar5,"-lda");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/main.c"
            ,0x60,"Reading linear feature transformation from %s\n",pcVar6);
    pfVar2 = feat;
    pcVar5 = cmd_ln_get();
    pcVar6 = cmd_ln_str_r(pcVar5,"-lda");
    pcVar5 = cmd_ln_get();
    lVar8 = cmd_ln_int_r(pcVar5,"-ldadim");
    iVar3 = feat_read_lda(pfVar2,pcVar6,(int32)lVar8);
    if (iVar3 < 0) goto LAB_00103829;
  }
  pcVar5 = cmd_ln_get();
  pcVar6 = cmd_ln_str_r(pcVar5,"-svspec");
  if (pcVar6 != (char *)0x0) {
    pcVar5 = cmd_ln_get();
    pcVar6 = cmd_ln_str_r(pcVar5,"-svspec");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/main.c"
            ,0x6a,"Using subvector specification %s\n",pcVar6);
    pcVar5 = cmd_ln_get();
    pcVar6 = cmd_ln_str_r(pcVar5,"-svspec");
    subvecs = parse_subvecs(pcVar6);
    if ((subvecs == (int32 **)0x0) || (iVar4 = feat_set_subvecs(feat,subvecs), iVar4 < 0))
    goto LAB_00103829;
  }
  pcVar5 = cmd_ln_get();
  iVar4 = cmd_ln_exists_r(pcVar5,"-agcthresh");
  if (iVar4 != 0) {
    pcVar5 = cmd_ln_get();
    pcVar6 = cmd_ln_str_r(pcVar5,"-agc");
    iVar4 = strcmp(pcVar6,"none");
    if (iVar4 != 0) {
      agc = feat->agc_struct;
      pcVar5 = cmd_ln_get();
      dVar12 = cmd_ln_float_r(pcVar5,"-agcthresh");
      agc_set_threshold(agc,(float32)(float)dVar12);
    }
  }
  if (feat->cmn_struct != (cmn_t *)0x0) {
    pcVar5 = cmd_ln_get();
    iVar4 = cmd_ln_exists_r(pcVar5,"-cmninit");
    if (iVar4 != 0) {
      pcVar5 = cmd_ln_get();
      pcVar6 = cmd_ln_str_r(pcVar5,"-cmninit");
      pcVar6 = __ckd_salloc__(pcVar6,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/main.c"
                              ,0x7c);
      pfVar2 = feat;
      pcVar11 = feat->cmn_struct;
      local_38 = pcVar6;
      for (lVar8 = 0; lVar8 < pcVar11->veclen; lVar8 = lVar8 + 1) {
        pcVar7 = strchr(pcVar6,0x2c);
        if (pcVar7 == (char *)0x0) {
          if (*pcVar6 != '\0') {
            dVar12 = atof(pcVar6);
            pcVar11->cmn_mean[lVar8] = (mfcc_t)(float)dVar12;
          }
          break;
        }
        *pcVar7 = '\0';
        dVar12 = atof(pcVar6);
        pcVar11 = pfVar2->cmn_struct;
        pcVar11->cmn_mean[lVar8] = (mfcc_t)(float)dVar12;
        pcVar6 = pcVar7 + 1;
      }
      ckd_free(local_38);
    }
  }
  pcVar5 = cmd_ln_get();
  pcVar6 = cmd_ln_str_r(pcVar5,"-segdir");
  if (pcVar6 != (char *)0x0) {
    pcVar5 = cmd_ln_get();
    pcVar6 = cmd_ln_str_r(pcVar5,"-segdir");
    corpus_set_seg_dir(pcVar6);
  }
  pcVar5 = cmd_ln_get();
  pcVar6 = cmd_ln_str_r(pcVar5,"-segext");
  if (pcVar6 != (char *)0x0) {
    pcVar5 = cmd_ln_get();
    pcVar6 = cmd_ln_str_r(pcVar5,"-segext");
    corpus_set_seg_ext(pcVar6);
  }
  pcVar5 = cmd_ln_get();
  pcVar6 = cmd_ln_str_r(pcVar5,"-cepdir");
  corpus_set_mfcc_dir(pcVar6);
  pcVar5 = cmd_ln_get();
  pcVar6 = cmd_ln_str_r(pcVar5,"-cepext");
  corpus_set_mfcc_ext(pcVar6);
  pcVar5 = cmd_ln_get();
  pcVar6 = cmd_ln_str_r(pcVar5,"-lsnfn");
  if (pcVar6 != (char *)0x0) {
    pcVar5 = cmd_ln_get();
    pcVar6 = cmd_ln_str_r(pcVar5,"-lsnfn");
    corpus_set_lsn_filename(pcVar6);
  }
  pcVar5 = cmd_ln_get();
  pcVar6 = cmd_ln_str_r(pcVar5,"-ctlfn");
  corpus_set_ctl_filename(pcVar6);
  pcVar5 = cmd_ln_get();
  lVar8 = cmd_ln_int_r(pcVar5,"-nskip");
  if ((int)lVar8 == 0) {
LAB_001037bb:
    pcVar5 = cmd_ln_get();
    lVar8 = cmd_ln_int_r(pcVar5,"-part");
    if ((int)lVar8 != 0) {
      pcVar5 = cmd_ln_get();
      lVar8 = cmd_ln_int_r(pcVar5,"-npart");
      if ((int)lVar8 != 0) {
        pcVar5 = cmd_ln_get();
        lVar8 = cmd_ln_int_r(pcVar5,"-part");
        pcVar5 = cmd_ln_get();
        lVar9 = cmd_ln_int_r(pcVar5,"-npart");
        corpus_set_partition((uint32)lVar8,(uint32)lVar9);
      }
    }
  }
  else {
    pcVar5 = cmd_ln_get();
    lVar8 = cmd_ln_int_r(pcVar5,"-runlen");
    if ((int)lVar8 == 0) goto LAB_001037bb;
    pcVar5 = cmd_ln_get();
    lVar8 = cmd_ln_int_r(pcVar5,"-nskip");
    pcVar5 = cmd_ln_get();
    lVar9 = cmd_ln_int_r(pcVar5,"-runlen");
    corpus_set_interval((uint32)lVar8,(uint32)lVar9);
  }
  iVar4 = corpus_init();
  if (iVar4 == 0) {
    pcVar5 = cmd_ln_get();
    pcVar6 = cmd_ln_str_r(pcVar5,"-moddeffn");
    if (pcVar6 == (char *)0x0) {
LAB_00103a74:
      iVar4 = init_gau(lex,mdef,feat);
      return (uint)(iVar4 != 0);
    }
    pcVar5 = cmd_ln_get();
    pcVar6 = cmd_ln_str_r(pcVar5,"-moddeffn");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/main.c"
            ,0xa8,"Reading %s\n",pcVar6);
    pcVar5 = cmd_ln_get();
    pcVar6 = cmd_ln_str_r(pcVar5,"-moddeffn");
    iVar3 = model_def_read(&mdef,pcVar6);
    if (iVar3 == 0) {
      pcVar5 = cmd_ln_get();
      pcVar6 = cmd_ln_str_r(pcVar5,"-ts2cbfn");
      iVar4 = strcmp(".semi.",pcVar6);
      if (iVar4 == 0) {
        puVar10 = semi_ts2cb(mdef->n_tied_state);
        pmVar1 = mdef;
        mdef->cb = puVar10;
        n_ts = pmVar1->n_tied_state;
        n_cb = 1;
      }
      else {
        iVar4 = strcmp(".cont.",pcVar6);
        if (iVar4 == 0) {
          puVar10 = cont_ts2cb(mdef->n_tied_state);
          pmVar1 = mdef;
          mdef->cb = puVar10;
          n_cb = pmVar1->n_tied_state;
          n_ts = n_cb;
        }
        else {
          iVar4 = strcmp(".ptm.",pcVar6);
          if (iVar4 == 0) {
            puVar10 = ptm_ts2cb(mdef);
            pmVar1 = mdef;
            mdef->cb = puVar10;
            n_ts = pmVar1->n_tied_state;
            n_cb = pmVar1->acmod_set->n_ci;
          }
          else {
            iVar4 = s3ts2cb_read(pcVar6,&mdef->cb,&n_ts,&n_cb);
            if (iVar4 != 0) goto LAB_00103829;
          }
        }
      }
      pcVar5 = cmd_ln_get();
      pcVar6 = cmd_ln_str_r(pcVar5,"-dictfn");
      if (pcVar6 == (char *)0x0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/main.c"
                ,0xcc,"You must specify a content dictionary using -dictfn\n");
        exit(1);
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/main.c"
              ,0xcf,"Reading %s\n",pcVar6);
      lex = lexicon_read((lexicon_t *)0x0,pcVar6,mdef->acmod_set);
      if (lex != (lexicon_t *)0x0) {
        pcVar5 = cmd_ln_get();
        pcVar6 = cmd_ln_str_r(pcVar5,"-fdictfn");
        if (pcVar6 != (char *)0x0) {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/main.c"
                  ,0xda,"Reading %s\n",pcVar6);
          lexicon_read(lex,pcVar6,mdef->acmod_set);
        }
        goto LAB_00103a74;
      }
    }
  }
LAB_00103829:
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/main.c"
          ,0xe9,"Errors initializing.\n");
  return 1;
}

Assistant:

static int
initialize(int argc,
	   char *argv[])
{
    const char *fdictfn;
    const char *dictfn;
    const char *ts2cbfn;
    uint32 n_ts;
    uint32 n_cb;

    /* define, parse and (partially) validate the command line */
    parse_cmd_ln(argc, argv);

    feat = 
        feat_init(cmd_ln_str("-feat"),
                  cmn_type_from_str(cmd_ln_str("-cmn")),
                  cmd_ln_boolean("-varnorm"),
                  agc_type_from_str(cmd_ln_str("-agc")),
                  1, cmd_ln_int32("-ceplen"));


    if (cmd_ln_str("-lda")) {
        E_INFO("Reading linear feature transformation from %s\n",
               cmd_ln_str("-lda"));
        if (feat_read_lda(feat,
                          cmd_ln_str("-lda"),
                          cmd_ln_int32("-ldadim")) < 0)
            return -1;
    }

    if (cmd_ln_str("-svspec")) {
        int32 **subvecs;
        E_INFO("Using subvector specification %s\n", 
               cmd_ln_str("-svspec"));
        if ((subvecs = parse_subvecs(cmd_ln_str("-svspec"))) == NULL)
            return -1;
        if ((feat_set_subvecs(feat, subvecs)) < 0)
            return -1;
    }

    if (cmd_ln_exists("-agcthresh")
        && 0 != strcmp(cmd_ln_str("-agc"), "none")) {
        agc_set_threshold(feat->agc_struct,
                          cmd_ln_float32("-agcthresh"));
    }

    if (feat->cmn_struct
        && cmd_ln_exists("-cmninit")) {
        char *c, *cc, *vallist;
        int32 nvals;

        vallist = ckd_salloc(cmd_ln_str("-cmninit"));
        c = vallist;
        nvals = 0;
        while (nvals < feat->cmn_struct->veclen
               && (cc = strchr(c, ',')) != NULL) {
            *cc = '\0';
            feat->cmn_struct->cmn_mean[nvals] = FLOAT2MFCC(atof(c));
            c = cc + 1;
            ++nvals;
        }
        if (nvals < feat->cmn_struct->veclen && *c != '\0') {
            feat->cmn_struct->cmn_mean[nvals] = FLOAT2MFCC(atof(c));
        }
        ckd_free(vallist);
    }


    if (cmd_ln_str("-segdir"))
	corpus_set_seg_dir(cmd_ln_str("-segdir"));
    if (cmd_ln_str("-segext"))
	corpus_set_seg_ext(cmd_ln_str("-segext"));

    corpus_set_mfcc_dir(cmd_ln_str("-cepdir"));
    corpus_set_mfcc_ext(cmd_ln_str("-cepext"));

    if (cmd_ln_str("-lsnfn"))
	corpus_set_lsn_filename(cmd_ln_str("-lsnfn"));

    corpus_set_ctl_filename(cmd_ln_str("-ctlfn"));

    if (cmd_ln_int32("-nskip") && cmd_ln_int32("-runlen")) {
        corpus_set_interval(cmd_ln_int32("-nskip"),
			    cmd_ln_int32("-runlen"));
    } else if (cmd_ln_int32("-part") && cmd_ln_int32("-npart")) {
	corpus_set_partition(cmd_ln_int32("-part"),
			     cmd_ln_int32("-npart"));
    }
    

    if (corpus_init() != S3_SUCCESS) {
	return S3_ERROR;
    }
    
    if (cmd_ln_str("-moddeffn")) {
	E_INFO("Reading %s\n", cmd_ln_str("-moddeffn"));
    
	/* Read in the model definitions.  Defines the set of
	   CI phones and context dependent phones.  Defines the
	   transition matrix tying and state level tying. */
	if (model_def_read(&mdef,
			   cmd_ln_str("-moddeffn")) != S3_SUCCESS) {
	    return S3_ERROR;
	}
	
	ts2cbfn = cmd_ln_str("-ts2cbfn");
	if (strcmp(SEMI_LABEL, ts2cbfn) == 0) {
	    mdef->cb = semi_ts2cb(mdef->n_tied_state);
	    n_ts = mdef->n_tied_state;
	    n_cb = 1;
	}
	else if (strcmp(CONT_LABEL, ts2cbfn) == 0) {
	    mdef->cb = cont_ts2cb(mdef->n_tied_state);
	    n_ts = mdef->n_tied_state;
	    n_cb = mdef->n_tied_state;
	}
	else if (strcmp(PTM_LABEL, ts2cbfn) == 0) {
	    mdef->cb = ptm_ts2cb(mdef);
	    n_ts = mdef->n_tied_state;
	    n_cb = mdef->acmod_set->n_ci;
	}
	else if (s3ts2cb_read(ts2cbfn,
			      &mdef->cb,
			      &n_ts,
			      &n_cb) != S3_SUCCESS) {
	    return S3_ERROR;
	}

	dictfn = cmd_ln_str("-dictfn");

	if (dictfn == NULL) {
	    E_FATAL("You must specify a content dictionary using -dictfn\n");
	}

	E_INFO("Reading %s\n", dictfn);
	
	lex = lexicon_read(NULL,	/* no lexicon to start */
			   dictfn,
			   mdef->acmod_set);
	if (lex == NULL)
	    return S3_ERROR;
    
	fdictfn = cmd_ln_str("-fdictfn");

	if (fdictfn) {
	    E_INFO("Reading %s\n", fdictfn);
	    
	    (void)lexicon_read(lex,	/* add filler words content lexicon */
			       fdictfn,
			       mdef->acmod_set);
	}
    }

    return S3_SUCCESS;
}